

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int voctok(voccxdef *ctx,char *cmd,char *outbuf,char **wrd,int lower,int cvt_ones,int show_errors)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  uint len_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ushort **ppuVar7;
  vocwdef *pvVar8;
  char *p_00;
  size_t sVar9;
  char *pcVar10;
  long in_RCX;
  byte *pbVar11;
  byte *in_RDX;
  byte *pbVar12;
  int iVar13;
  byte *in_RSI;
  voccxdef *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar14;
  int in_stack_00000008;
  int hmode;
  char c;
  char quote;
  char *lenptr;
  int wrdlen;
  int len_1;
  char typ;
  char *endp;
  char *p_1;
  uint l3;
  char *p3;
  uint l2;
  char *p2;
  uint l1;
  uint len;
  char *w;
  char *p;
  int l;
  vocspdef *x;
  int i;
  char *in_stack_ffffffffffffff30;
  byte local_b8;
  char *local_88;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  voccxdef *in_stack_ffffffffffffffb0;
  int local_44;
  vocspdef *in_stack_ffffffffffffffc0;
  int local_34;
  byte *local_20;
  byte *local_18;
  
  local_34 = 0;
  local_18 = in_RSI;
  local_20 = in_RDX;
LAB_0023616b:
  while( true ) {
    bVar14 = false;
    if (*local_18 < 0x80) {
      ppuVar7 = __ctype_b_loc();
      bVar14 = ((*ppuVar7)[(int)(uint)*local_18] & 0x2000) != 0;
    }
    if (!bVar14) break;
    local_18 = local_18 + 1;
  }
  if (*local_18 == 0) {
    *(byte **)(in_RCX + (long)local_34 * 8) = local_20;
    *local_20 = 0;
    return local_34;
  }
  iVar13 = local_34 + 1;
  *(byte **)(in_RCX + (long)local_34 * 8) = local_20;
  if (((0x7f < *local_18) ||
      (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)*local_18] & 0x400) != 0)) ||
     (*local_18 == 0x2d)) {
    do {
      bVar14 = true;
      if (*local_18 < 0x80) {
        ppuVar7 = __ctype_b_loc();
        bVar14 = true;
        if (((*ppuVar7)[(int)(uint)*local_18] & 0x400) == 0) {
          if (*local_18 < 0x80) {
            ppuVar7 = __ctype_b_loc();
            bVar14 = true;
            if (((*ppuVar7)[(int)(uint)*local_18] & 0x800) != 0) goto LAB_00236330;
          }
          bVar14 = true;
          if (*local_18 != 0x27) {
            bVar14 = *local_18 == 0x2d;
          }
        }
      }
LAB_00236330:
      if (!bVar14) goto LAB_002363d8;
      if (((*local_18 < 0x80) &&
          (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)*local_18] & 0x100) != 0)) &&
         (in_R8D != 0)) {
        iVar6 = tolower((int)(char)*local_18);
        local_b8 = (byte)iVar6;
      }
      else {
        local_b8 = *local_18;
      }
      *local_20 = local_b8;
      local_18 = local_18 + 1;
      local_20 = local_20 + 1;
    } while( true );
  }
  local_34 = iVar13;
  if ((*local_18 < 0x80) &&
     (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)*local_18] & 0x800) != 0)) {
    do {
      if (*local_18 < 0x80) {
        ppuVar7 = __ctype_b_loc();
        bVar14 = true;
        if (((*ppuVar7)[(int)(uint)*local_18] & 0x800) == 0) goto LAB_002369f6;
      }
      else {
LAB_002369f6:
        bVar14 = true;
        if (*local_18 < 0x80) {
          ppuVar7 = __ctype_b_loc();
          bVar14 = true;
          if ((((*ppuVar7)[(int)(uint)*local_18] & 0x400) == 0) &&
             (bVar14 = true, *local_18 != 0x27)) {
            bVar14 = *local_18 == 0x2d;
          }
        }
      }
      if (!bVar14) goto LAB_00236d2a;
      *local_20 = *local_18;
      local_20 = local_20 + 1;
      local_18 = local_18 + 1;
    } while( true );
  }
  bVar2 = *local_18;
  if (bVar2 == 0x21) goto LAB_00236b17;
  if ((bVar2 == 0x22) || (bVar2 == 0x27)) {
    bVar2 = *local_18;
    pbVar11 = local_20 + 1;
    *local_20 = 0x22;
    local_20 = local_20 + 3;
    pbVar12 = local_18;
    while( true ) {
      local_18 = pbVar12 + 1;
      bVar14 = false;
      if (*local_18 != 0) {
        bVar14 = *local_18 != bVar2;
      }
      if (!bVar14) break;
      bVar3 = *local_18;
      if (bVar3 == 0x5c) {
        *local_20 = 0x5c;
        local_20 = local_20 + 1;
      }
      *local_20 = bVar3;
      local_20 = local_20 + 1;
      pbVar12 = local_18;
    }
    oswp2(pbVar11,(int)local_20 - (int)pbVar11);
    if (*local_18 == bVar2) {
      local_18 = pbVar12 + 2;
    }
  }
  else if (bVar2 == 0x2c) {
LAB_00236b4a:
    *local_20 = 0x2c;
    local_18 = local_18 + 1;
    local_20 = local_20 + 1;
  }
  else {
    if (bVar2 != 0x2e) {
      if (bVar2 == 0x3a) goto LAB_00236b4a;
      if ((bVar2 != 0x3b) && (bVar2 != 0x3f)) {
        if (in_stack_00000008 != 0) {
          iVar13 = tio_is_html_mode();
          if (iVar13 != 0) {
            outformat(in_stack_ffffffffffffff30);
          }
          vocerr(in_RDI,1,"I don\'t understand the punctuation \"%c\".",
                 (ulong)(uint)(int)(char)*local_18);
          if (iVar13 != 0) {
            outformat(in_stack_ffffffffffffff30);
          }
        }
        return -1;
      }
    }
LAB_00236b17:
    *local_20 = 0x2e;
    local_18 = local_18 + 1;
    local_20 = local_20 + 1;
  }
  goto LAB_00236d2a;
LAB_002363d8:
  pcVar10 = *(char **)(in_RCX + (long)local_34 * 8);
  len_00 = (int)local_20 - (int)pcVar10;
  pbVar12 = local_20;
  pbVar11 = local_18;
  if (*local_18 == 0x2e) {
    pbVar12 = local_20 + 1;
    *local_20 = *local_18;
    *pbVar12 = 0;
    len_00 = len_00 + 1;
    pvVar8 = vocffw(in_stack_ffffffffffffffb0,pcVar10,len_00,in_stack_ffffffffffffff98,
                    in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                    (vocseadef *)in_stack_ffffffffffffffc0);
    pbVar11 = local_18 + 1;
    if ((pvVar8 == (vocwdef *)0x0) &&
       (pvVar8 = vocffw(in_stack_ffffffffffffffb0,pcVar10,len_00,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                        (vocseadef *)in_stack_ffffffffffffffc0), pvVar8 == (vocwdef *)0x0)) {
      len_00 = len_00 - 1;
      pbVar12 = local_20;
      pbVar11 = local_18;
    }
  }
  local_18 = pbVar11;
  local_20 = pbVar12;
  *local_20 = 0;
  in_stack_ffffffffffffffb0 = (voccxdef *)in_RDI->voccxcpp;
  for (local_44 = in_RDI->voccxcpl; local_44 != 0;
      local_44 = local_44 - (uVar4 + in_stack_ffffffffffffff94 + uVar5)) {
    uVar4 = osrp2(in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffff98 =
         (char *)((long)in_stack_ffffffffffffffb0->voccxinh + ((ulong)uVar4 - 0x58));
    in_stack_ffffffffffffff94 = osrp2(in_stack_ffffffffffffff98);
    p_00 = in_stack_ffffffffffffff98 + in_stack_ffffffffffffff94;
    uVar5 = osrp2(p_00);
    if (((1 < iVar13) && (len_00 == in_stack_ffffffffffffff94 - 2)) &&
       ((iVar6 = memcmp(pcVar10,in_stack_ffffffffffffff98 + 2,(ulong)len_00), iVar6 == 0 &&
        ((sVar9 = strlen(*(char **)(in_RCX + (long)(local_34 + -1) * 8)), sVar9 == uVar4 - 2 &&
         (iVar6 = memcmp(*(void **)(in_RCX + (long)(local_34 + -1) * 8),
                         (char *)((long)&in_stack_ffffffffffffffb0->voccxerr + 2),(ulong)(uVar4 - 2)
                        ), iVar6 == 0)))))) {
      memcpy(*(void **)(in_RCX + (long)(local_34 + -1) * 8),p_00 + 2,(ulong)(uVar5 - 2));
      *(undefined1 *)(*(long *)(in_RCX + (long)(local_34 + -1) * 8) + -2 + (ulong)uVar5) = 0;
      iVar13 = local_34;
      break;
    }
    in_stack_ffffffffffffffb0 = (voccxdef *)(p_00 + uVar5);
  }
  local_34 = iVar13;
  if (in_RDI->voccxspp == (char *)0x0) {
    for (in_stack_ffffffffffffffc0 = vocsptab;
        ((vocseadef *)in_stack_ffffffffffffffc0)->v != (vocdef *)0x0;
        in_stack_ffffffffffffffc0 = (vocspdef *)&((vocseadef *)in_stack_ffffffffffffffc0)->wrd1) {
      iVar13 = strncmp(*(char **)(in_RCX + (long)(local_34 + -1) * 8),
                       (char *)((vocseadef *)in_stack_ffffffffffffffc0)->v,6);
      if ((iVar13 == 0) &&
         (((in_R9D != 0 ||
           ((*(char *)&((vocseadef *)in_stack_ffffffffffffffc0)->vw != 'N' &&
            (*(char *)&((vocseadef *)in_stack_ffffffffffffffc0)->vw != 'P')))) &&
          (*(char *)&((vocseadef *)in_stack_ffffffffffffffc0)->vw != 'O')))) {
        **(undefined1 **)(in_RCX + (long)(local_34 + -1) * 8) =
             *(undefined1 *)&((vocseadef *)in_stack_ffffffffffffffc0)->vw;
        *(undefined1 *)(*(long *)(in_RCX + (long)(local_34 + -1) * 8) + 1) = 0;
        break;
      }
    }
  }
  else {
    sVar9 = strlen(*(char **)(in_RCX + (long)(local_34 + -1) * 8));
    local_88 = in_RDI->voccxspp;
    pcVar10 = local_88 + in_RDI->voccxspl;
    for (; local_88 < pcVar10; local_88 = local_88 + 2 + iVar13) {
      cVar1 = *local_88;
      iVar13 = (int)local_88[1];
      if ((((iVar13 == (int)sVar9) &&
           (iVar6 = memcmp(local_88 + 2,*(void **)(in_RCX + (long)(local_34 + -1) * 8),(long)iVar13)
           , iVar6 == 0)) && ((in_R9D != 0 || ((cVar1 != 'N' && (cVar1 != 'P')))))) &&
         (cVar1 != 'O')) {
        **(char **)(in_RCX + (long)(local_34 + -1) * 8) = cVar1;
        *(undefined1 *)(*(long *)(in_RCX + (long)(local_34 + -1) * 8) + 1) = 0;
        break;
      }
    }
  }
  pcVar10 = *(char **)(in_RCX + (long)(local_34 + -1) * 8);
  sVar9 = strlen(pcVar10);
  local_20 = (byte *)(pcVar10 + sVar9);
LAB_00236d2a:
  *local_20 = 0;
  local_20 = local_20 + 1;
  goto LAB_0023616b;
}

Assistant:

int voctok(voccxdef *ctx, char *cmd, char *outbuf, char **wrd,
           int lower, int cvt_ones, int show_errors)
{
    int       i;
    vocspdef *x;
    int       l;
    char     *p;
    char     *w;
    uint      len;

    for (i = 0 ;; )
    {
        while (vocisspace(*cmd)) cmd++;
        if (!*cmd)
        {
            wrd[i] = outbuf;
            *outbuf = '\0';
            return(i);
        }

        wrd[i++] = outbuf;
        if (vocisalpha(*cmd) || *cmd == '-')
        {
            while(vocisalpha(*cmd) || vocisdigit(*cmd) ||
                  *cmd=='\'' || *cmd=='-')
            {
                *outbuf++ = (vocisupper(*cmd) && lower) ? tolower(*cmd) : *cmd;
                ++cmd;
            }
            
            /*
             *   Check for a special case:  abbreviations that end in a
             *   period.  For example, "Mr. Patrick J. Wayne."  We wish
             *   to absorb the period after "Mr" and the one after "J"
             *   into the respective words; we detect this condition by
             *   actually trying to find a word in the dictionary that
             *   has the period.
             */
            w = wrd[i-1];
            len = outbuf - w;
            if (*cmd == '.')
            {
                *outbuf++ = *cmd++;           /* add the period to the word */
                *outbuf = '\0';                        /* null-terminate it */
                ++len;
                if (!vocffw(ctx, (char *)w, len, 0, 0, PRP_NOUN,
                            (vocseadef *)0)
                    && !vocffw(ctx, (char *)w, len, 0, 0, PRP_ADJ,
                               (vocseadef *)0))
                {
                    /* no word with period in dictionary - remove period */
                    --outbuf;
                    --cmd;
                    --len;
                }
            }

            /* null-terminate the buffer */
            *outbuf = '\0';

            /* find compound words and glue them together */
            for (p = ctx->voccxcpp, l = ctx->voccxcpl ; l ; )
            {
                uint   l1 = osrp2(p);
                char  *p2 = p + l1;                      /* get second word */
                uint   l2 = osrp2(p2);
                char  *p3 = p2 + l2;                   /* get compound word */
                uint   l3 = osrp2(p3);
                
                if (i > 1 && len == (l2 - 2)
                    && !memcmp(w, p2 + 2, (size_t)len)
                    && strlen((char *)wrd[i-2]) == (l1 - 2)
                    && !memcmp(wrd[i-2], p + 2, (size_t)(l1 - 2)))
                {
                    memcpy(wrd[i-2], p3 + 2, (size_t)(l3 - 2));
                    *(wrd[i-2] + l3 - 2) = '\0';
                    --i;
                    break;
                }

                /* move on to the next word */
                l -= l1 + l2 + l3;
                p = p3 + l3;
            }

            /*
             *   Find any special keywords, and set to appropriate flag
             *   char.  Note that we no longer convert "of" in this
             *   fashion; "of" is now handled separately in order to
             *   facilitate its use as an ordinary preposition. 
             */
            if (ctx->voccxspp)
            {
                char  *p;
                char  *endp;
                char   typ;
                int    len;
                int    wrdlen = strlen((char *)wrd[i-1]);
                
                for (p = ctx->voccxspp, endp = p + ctx->voccxspl ;
                     p < endp ; )
                {
                    typ = *p++;
                    len = *p++;
                    if (len == wrdlen && !memcmp(p, wrd[i-1], (size_t)len)
                        && (cvt_ones || (typ != VOCW_ONE && typ != VOCW_ONES))
                        && typ != VOCW_OF)
                    {
                        *wrd[i-1] = typ;
                        *(wrd[i-1] + 1) = '\0';
                        break;
                    }
                    p += len;
                }
            }
            else
            {
                for (x = vocsptab ; x->vocspin ; ++x)
                {
                    if (!strncmp((char *)wrd[i-1], (char *)x->vocspin,
                                 (size_t)6)
                        && (cvt_ones ||
                            (x->vocspout != VOCW_ONE
                             && x->vocspout != VOCW_ONES))
                        && x->vocspout != VOCW_OF)
                    {
                        *wrd[i-1] = x->vocspout;
                        *(wrd[i-1] + 1) = '\0';
                        break;
                    }
                }
            }

            /* make sure the output pointer is fixed up to the right spot */
            outbuf = wrd[i-1];
            outbuf += strlen((char *)outbuf);
        }
        else if (vocisdigit( *cmd ))
        {
            while(vocisdigit(*cmd) || vocisalpha(*cmd)
                  || *cmd == '\'' || *cmd == '-')
                *outbuf++ = *cmd++;
        }
        else switch( *cmd )
        {
        case '.':
        case '!':
        case '?':
        case ';':
            *outbuf++ = VOCW_THEN;
            ++cmd;
            break;

        case ',':
        case ':':
            *outbuf++ = VOCW_AND;
            ++cmd;
            break;

        case '"':
        case '\'':
            {
                char  *lenptr;
                char   quote = *cmd++;

                /* 
                 *   remember that this is a quoted string (it doesn't
                 *   matter whether they're actually using single or
                 *   double quotes - in either case, we use '"' as the
                 *   flag to indicate that it's a quote string)
                 */
                *outbuf++ = '"';

                /* make room for the length prefix */
                lenptr = outbuf;
                outbuf += 2;

                /* copy up to the matching close quote */
                while (*cmd && *cmd != quote)
                {
                    char c;

                    /* get this character */
                    c = *cmd++;
                    
                    /* escape the character if necessary */
                    switch(c)
                    {
                    case '\\':
                        *outbuf++ = '\\';
                        break;
                    }

                    /* copy this character */
                    *outbuf++ = c;
                }
                
                oswp2(lenptr, ((int)(outbuf - lenptr)));
                if (*cmd == quote) cmd++;
                break;
            }

        default:
            /* display an error if appropriate */
            if (show_errors)
            {
                int hmode = tio_is_html_mode();

                /* 
                 *   if we're in HTML mode, switch out momentarily, so that
                 *   we show the character literally, even if it's a
                 *   markup-significant character (such as '<' or '&') 
                 */
                if (hmode)
                    tioputs(ctx->voccxtio, "\\H-");
                
                /* show the message */
                vocerr(ctx, VOCERR(1),
                       "I don't understand the punctuation \"%c\".", *cmd);

                /* restore HTML mode if appropriate */
                if (hmode)
                    tioputs(ctx->voccxtio, "\\H+");
            }

            /* return failure */
            return -1;
        }

        /* null-terminate the result */
        *outbuf++ = '\0';
    }
}